

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall
Assimp::ASEImporter::BuildNodes
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes)

{
  float fVar1;
  pointer ppBVar2;
  BaseNode *pBVar3;
  BaseNode **ppBVar4;
  size_t __n;
  pointer ppaVar5;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *pvVar6;
  int iVar7;
  uint uVar8;
  aiNode *paVar9;
  aiNode **ppaVar10;
  aiNode *this_00;
  pointer ppBVar11;
  aiScene *paVar12;
  runtime_error *this_01;
  BaseNode **ppBVar13;
  ulong uVar14;
  long lVar15;
  pointer ppaVar16;
  BaseNode **ppBVar17;
  ulong uVar18;
  vector<aiNode_*,_std::allocator<aiNode_*>_> apcNodes;
  vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_> aiList;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *__range1;
  aiNode *pcNode;
  vector<aiNode_*,_std::allocator<aiNode_*>_> local_b8;
  BaseNode **local_98;
  iterator iStack_90;
  BaseNode **local_88;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *local_80;
  aiNode *local_78;
  aiMatrix4x4 local_70;
  
  local_80 = nodes;
  if (this->pcScene == (aiScene *)0x0) {
    __assert_fail("__null != pcScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASELoader.cpp"
                  ,0x287,"void Assimp::ASEImporter::BuildNodes(std::vector<BaseNode *> &)");
  }
  paVar9 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar9);
  this->pcScene->mRootNode = paVar9;
  (paVar9->mName).length = 9;
  builtin_strncpy((paVar9->mName).data,"<ASERoot>",10);
  this->pcScene->mRootNode->mNumChildren = 1;
  ppaVar10 = (aiNode **)operator_new__(8);
  this->pcScene->mRootNode->mChildren = ppaVar10;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pvVar6 = local_80;
  *this->pcScene->mRootNode->mChildren = this_00;
  this_00->mParent = paVar9;
  ppBVar2 = (local_80->
            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar11 = (local_80->
                  super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppBVar11 != ppBVar2;
      ppBVar11 = ppBVar11 + 1) {
    pBVar3 = *ppBVar11;
    fVar1 = (pBVar3->mTransform).b1;
    (pBVar3->mTransform).b1 = (pBVar3->mTransform).a2;
    (pBVar3->mTransform).a2 = fVar1;
    fVar1 = (pBVar3->mTransform).c1;
    (pBVar3->mTransform).c1 = (pBVar3->mTransform).a3;
    (pBVar3->mTransform).a3 = fVar1;
    fVar1 = (pBVar3->mTransform).c2;
    (pBVar3->mTransform).c2 = (pBVar3->mTransform).b3;
    (pBVar3->mTransform).b3 = fVar1;
    fVar1 = (pBVar3->mTransform).d1;
    (pBVar3->mTransform).d1 = (pBVar3->mTransform).a4;
    (pBVar3->mTransform).a4 = fVar1;
    fVar1 = (pBVar3->mTransform).d2;
    (pBVar3->mTransform).d2 = (pBVar3->mTransform).b4;
    (pBVar3->mTransform).b4 = fVar1;
    fVar1 = (pBVar3->mTransform).d3;
    (pBVar3->mTransform).d3 = (pBVar3->mTransform).c4;
    (pBVar3->mTransform).c4 = fVar1;
  }
  local_70.a1 = 1.0;
  local_70.a2 = 0.0;
  local_70.a3 = 0.0;
  local_70.a4 = 0.0;
  local_70.b1 = 0.0;
  local_70.b2 = 1.0;
  local_70.b3 = 0.0;
  local_70.b4 = 0.0;
  local_70.c1 = 0.0;
  local_70.c2 = 0.0;
  local_70.c3 = 1.0;
  local_70.c4 = 0.0;
  local_70.d1 = 0.0;
  local_70.d2 = 0.0;
  local_70.d3 = 0.0;
  local_70.d4 = 1.0;
  AddNodes(this,local_80,this_00,(char *)0x0,&local_70);
  local_98 = (BaseNode **)0x0;
  iStack_90._M_current = (BaseNode **)0x0;
  local_88 = (BaseNode **)0x0;
  ppBVar17 = (pvVar6->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppBVar4 = (pvVar6->
            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar17 != ppBVar4) {
    do {
      pBVar3 = *ppBVar17;
      if (pBVar3->mProcessed == false) {
        for (ppBVar13 = (local_80->
                        super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppBVar13 != ppBVar4;
            ppBVar13 = ppBVar13 + 1) {
          if (ppBVar13 != ppBVar17) {
            __n = ((*ppBVar13)->mName)._M_string_length;
            if ((__n == (pBVar3->mParent)._M_string_length) &&
               ((__n == 0 ||
                (iVar7 = bcmp(((*ppBVar13)->mName)._M_dataplus._M_p,
                              (pBVar3->mParent)._M_dataplus._M_p,__n), iVar7 == 0))))
            goto LAB_003fae92;
          }
        }
        if (iStack_90._M_current == local_88) {
          std::vector<Assimp::ASE::BaseNode_const*,std::allocator<Assimp::ASE::BaseNode_const*>>::
          _M_realloc_insert<Assimp::ASE::BaseNode_const*const&>
                    ((vector<Assimp::ASE::BaseNode_const*,std::allocator<Assimp::ASE::BaseNode_const*>>
                      *)&local_98,iStack_90,ppBVar17);
        }
        else {
          *iStack_90._M_current = pBVar3;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
      }
LAB_003fae92:
      ppBVar17 = ppBVar17 + 1;
    } while (ppBVar17 != ppBVar4);
    if (local_98 != iStack_90._M_current) {
      local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (aiNode **)0x0;
      local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (aiNode **)0x0;
      local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (aiNode **)0x0;
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::reserve
                (&local_b8,
                 (ulong)this->pcScene->mRootNode->mNumChildren +
                 ((long)iStack_90._M_current - (long)local_98 >> 3));
      paVar9 = this->pcScene->mRootNode;
      if (paVar9->mNumChildren != 0) {
        lVar15 = 0;
        uVar14 = 0;
        do {
          ppaVar10 = (aiNode **)((long)paVar9->mChildren + lVar15);
          if (local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,ppaVar10);
          }
          else {
            *local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish = *ppaVar10;
            local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar14 = uVar14 + 1;
          paVar9 = this->pcScene->mRootNode;
          lVar15 = lVar15 + 8;
        } while (uVar14 < paVar9->mNumChildren);
      }
      if (paVar9->mChildren != (aiNode **)0x0) {
        operator_delete__(paVar9->mChildren);
      }
      ppBVar17 = local_98;
      if (local_98 != iStack_90._M_current) {
        do {
          pBVar3 = *ppBVar17;
          paVar9 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar9);
          paVar9->mParent = this->pcScene->mRootNode;
          uVar14 = (pBVar3->mName)._M_string_length;
          local_78 = paVar9;
          if (uVar14 < 0x400) {
            (paVar9->mName).length = (ai_uint32)uVar14;
            memcpy((paVar9->mName).data,(pBVar3->mName)._M_dataplus._M_p,uVar14);
            (paVar9->mName).data[uVar14] = '\0';
          }
          AddMeshes(this,pBVar3,paVar9);
          local_70.a1 = 1.0;
          local_70.a2 = 0.0;
          local_70.a3 = 0.0;
          local_70.a4 = 0.0;
          local_70.b1 = 0.0;
          local_70.b2 = 1.0;
          local_70.b3 = 0.0;
          local_70.b4 = 0.0;
          local_70.c1 = 0.0;
          local_70.c2 = 0.0;
          local_70.c3 = 1.0;
          local_70.c4 = 0.0;
          local_70.d1 = 0.0;
          local_70.d2 = 0.0;
          local_70.d3 = 0.0;
          local_70.d4 = 1.0;
          AddNodes(this,local_80,local_78,(local_78->mName).data,&local_70);
          if (local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_78);
          }
          else {
            *local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_78;
            local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          ppBVar17 = ppBVar17 + 1;
        } while (ppBVar17 != iStack_90._M_current);
      }
      ppaVar5 = local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppaVar16 = local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      uVar18 = (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar14 = 0xffffffffffffffff;
      if (-1 < (long)uVar18) {
        uVar14 = uVar18;
      }
      ppaVar10 = (aiNode **)operator_new__(uVar14);
      this->pcScene->mRootNode->mChildren = ppaVar10;
      if (ppaVar5 == ppaVar16) {
        uVar18 = (long)uVar18 >> 3;
      }
      else {
        uVar8 = 1;
        uVar14 = 0;
        do {
          this->pcScene->mRootNode->mChildren[uVar14] = ppaVar16[uVar14];
          uVar14 = (ulong)uVar8;
          uVar18 = (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          uVar8 = uVar8 + 1;
          ppaVar16 = local_b8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (uVar14 < uVar18);
      }
      this->pcScene->mRootNode->mNumChildren = (uint)uVar18;
      if (ppaVar16 != (aiNode **)0x0) {
        operator_delete(ppaVar16,(long)local_b8.
                                       super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ppaVar16);
      }
    }
  }
  paVar12 = this->pcScene;
  if (paVar12->mNumMeshes != 0) {
    uVar14 = 0;
    do {
      paVar12->mMeshes[uVar14]->mColors[2] = (aiColor4D *)0x0;
      uVar14 = uVar14 + 1;
      paVar12 = this->pcScene;
    } while (uVar14 < paVar12->mNumMeshes);
  }
  paVar9 = paVar12->mRootNode;
  if (paVar9->mNumChildren == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._0_8_ = &local_70.b1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"ASE: No nodes loaded. The file is either empty or corrupt","");
    std::runtime_error::runtime_error(this_01,(string *)&local_70);
    *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  (paVar9->mTransformation).a1 = 1.0;
  (paVar9->mTransformation).a2 = 0.0;
  (paVar9->mTransformation).a3 = 0.0;
  (paVar9->mTransformation).a4 = 0.0;
  (paVar9->mTransformation).b1 = 0.0;
  (paVar9->mTransformation).b2 = 0.0;
  (paVar9->mTransformation).b3 = 1.0;
  (paVar9->mTransformation).b4 = 0.0;
  (paVar9->mTransformation).c1 = 0.0;
  (paVar9->mTransformation).c2 = -1.0;
  (paVar9->mTransformation).c3 = 0.0;
  (paVar9->mTransformation).c4 = 0.0;
  (paVar9->mTransformation).d1 = 0.0;
  (paVar9->mTransformation).d2 = 0.0;
  (paVar9->mTransformation).d3 = 0.0;
  (paVar9->mTransformation).d4 = 1.0;
  if (local_98 != (BaseNode **)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void ASEImporter::BuildNodes(std::vector<BaseNode*>& nodes) {
    ai_assert(NULL != pcScene);

    // allocate the one and only root node
    aiNode* root = pcScene->mRootNode = new aiNode();
    root->mName.Set("<ASERoot>");

    // Setup the coordinate system transformation
    pcScene->mRootNode->mNumChildren = 1;
    pcScene->mRootNode->mChildren = new aiNode*[1];
    aiNode* ch = pcScene->mRootNode->mChildren[0] = new aiNode();
    ch->mParent = root;

    // Change the transformation matrix of all nodes
    for (BaseNode *node : nodes) {
        aiMatrix4x4& m = node->mTransform;
        m.Transpose(); // row-order vs column-order
    }

    // add all nodes
    AddNodes(nodes,ch,NULL);

    // now iterate through al nodes and find those that have not yet
    // been added to the nodegraph (= their parent could not be recognized)
    std::vector<const BaseNode*> aiList;
    for (std::vector<BaseNode*>::iterator it = nodes.begin(), end = nodes.end();it != end; ++it)    {
        if ((*it)->mProcessed) {
            continue;
        }

        // check whether our parent is known
        bool bKnowParent = false;

        // search the list another time, starting *here* and try to find out whether
        // there is a node that references *us* as a parent
        for (std::vector<BaseNode*>::const_iterator it2 = nodes.begin();it2 != end; ++it2) {
            if (it2 == it) {
                continue;
            }

            if ((*it2)->mName == (*it)->mParent)    {
                bKnowParent = true;
                break;
            }
        }
        if (!bKnowParent)   {
            aiList.push_back(*it);
        }
    }

    // Are there ane orphaned nodes?
    if (!aiList.empty())    {
        std::vector<aiNode*> apcNodes;
        apcNodes.reserve(aiList.size() + pcScene->mRootNode->mNumChildren);

        for (unsigned int i = 0; i < pcScene->mRootNode->mNumChildren;++i)
            apcNodes.push_back(pcScene->mRootNode->mChildren[i]);

        delete[] pcScene->mRootNode->mChildren;
        for (std::vector<const BaseNode*>::/*const_*/iterator i =  aiList.begin();i != aiList.end();++i)    {
            const ASE::BaseNode* src = *i;

            // The parent is not known, so we can assume that we must add
            // this node to the root node of the whole scene
            aiNode* pcNode = new aiNode();
            pcNode->mParent = pcScene->mRootNode;
            pcNode->mName.Set(src->mName);
            AddMeshes(src,pcNode);
            AddNodes(nodes,pcNode,pcNode->mName.data);
            apcNodes.push_back(pcNode);
        }

        // Regenerate our output array
        pcScene->mRootNode->mChildren = new aiNode*[apcNodes.size()];
        for (unsigned int i = 0; i < apcNodes.size();++i)
            pcScene->mRootNode->mChildren[i] = apcNodes[i];

        pcScene->mRootNode->mNumChildren = (unsigned int)apcNodes.size();
    }

    // Reset the third color set to NULL - we used this field to store a temporary pointer
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)
        pcScene->mMeshes[i]->mColors[2] = NULL;

    // The root node should not have at least one child or the file is valid
    if (!pcScene->mRootNode->mNumChildren) {
        throw DeadlyImportError("ASE: No nodes loaded. The file is either empty or corrupt");
    }

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pcScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);
}